

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O2

NumericExpr __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::MakeNumericConstant
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,double value)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"numeric constant in nonlinear expression",&local_31);
  TestProblemBuilder::ReportUnhandledConstruct((TestProblemBuilder *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return (NumericExpr)NULL_ID;
}

Assistant:

NumericExpr MakeNumericConstant(double value) {
    internal::Unused(value);
    MP_DISPATCH(ReportUnhandledConstruct(
                  "numeric constant in nonlinear expression"));
    return NumericExpr();
  }